

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler2>::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler2>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler2>
           *this)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  uint *puVar5;
  BinaryReaderBase *this_00;
  int iVar6;
  ComplInfo local_4c;
  ulong local_48 [2];
  ArgList local_38;
  
  iVar6 = *(int *)(*(long *)(this + 8) + 4);
  if (0 < iVar6) {
    do {
      this_00 = *(BinaryReaderBase **)this;
      pcVar2 = (this_00->super_ReaderBase).ptr_;
      (this_00->super_ReaderBase).token_ = pcVar2;
      pcVar4 = pcVar2 + 1;
      (this_00->super_ReaderBase).ptr_ = pcVar4;
      switch(*pcVar2) {
      case '0':
        (this_00->super_ReaderBase).token_ = pcVar4;
        BinaryReaderBase::Read(this_00,8);
        this_00 = *(BinaryReaderBase **)this;
        pcVar4 = (this_00->super_ReaderBase).ptr_;
      case '1':
      case '2':
      case '4':
        (this_00->super_ReaderBase).token_ = pcVar4;
        BinaryReaderBase::Read(this_00,8);
        break;
      case '3':
        break;
      case '5':
        (this_00->super_ReaderBase).token_ = pcVar4;
        puVar5 = (uint *)BinaryReaderBase::Read(this_00,4);
        uVar1 = *puVar5;
        uVar3 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                          (*(BinaryReader<mp::internal::IdentityConverter> **)this);
        if ((uVar3 == 0) || (**(int **)(this + 8) < (int)uVar3)) {
          local_48[0] = (ulong)uVar3;
          local_38.field_1.values_ = (Value *)local_48;
          local_38.types_ = 2;
          BinaryReaderBase::ReportError(*(BinaryReaderBase **)this,(CStringRef)0x26c0a7,&local_38);
        }
        ComplInfo::ComplInfo(&local_4c,uVar1 & 3);
        break;
      default:
        local_38.field_1.values_ = (Value *)local_48;
        local_48[0] = 0;
        local_48[1] = 0;
        local_38.types_ = 0;
        BinaryReaderBase::ReportError(this_00,(CStringRef)0x2656a6,&local_38);
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  return;
}

Assistant:

int num_items() const { return this->reader_.header_.num_algebraic_cons; }